

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvapeeki.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint32_t uVar2;
  char **in_RSI;
  int in_EDI;
  int j;
  int s;
  uint32_t z [64];
  uint32_t selector;
  int ls;
  int32_t i;
  int32_t b;
  int32_t a;
  int cnum;
  int c;
  int local_140;
  uint local_13c;
  uint32_t auStack_138 [67];
  uint32_t local_2c;
  int local_28;
  uint32_t local_24;
  int local_20;
  uint local_1c;
  int local_18;
  int local_14;
  char **local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  iVar1 = nva_init();
  if (iVar1 == 0) {
    local_18 = 0;
    while (local_14 = getopt(local_8,local_10,"c:"), local_14 != -1) {
      if (local_14 == 99) {
        __isoc99_sscanf(_optarg,"%d",&local_18);
      }
    }
    if (local_18 < nva_cardsnum) {
      local_20 = 4;
      if (_optind < local_8) {
        __isoc99_sscanf(local_10[_optind],"%x",&local_1c);
        local_1c = local_1c & 0xfffffffc;
        if (_optind + 1 < local_8) {
          __isoc99_sscanf(local_10[_optind + 1],"%x",&local_20);
        }
        local_28 = 1;
        for (; 0 < local_20; local_20 = local_20 + -4) {
          local_2c = local_1c | 0xffc;
          local_13c = 0;
          for (local_24 = 0; (int)local_24 < 0x40; local_24 = local_24 + 1) {
            nva_wr32(local_18,local_2c,local_24);
            uVar2 = nva_rd32(local_18,local_1c);
            auStack_138[(int)local_24] = uVar2;
            if (uVar2 != 0) {
              local_13c = 1 << ((byte)((int)local_24 / 4) & 0x1f) | local_13c;
            }
          }
          nva_wr32(local_18,local_2c,0);
          for (local_140 = 0; local_140 < 0x10; local_140 = local_140 + 1) {
            if ((local_13c & 1 << ((byte)local_140 & 0x1f)) == 0) {
              if (local_28 != 0) {
                printf("...\n");
                local_28 = 0;
              }
            }
            else {
              local_28 = 1;
              printf("%08x.%02x:",(ulong)local_1c,(ulong)(uint)(local_140 << 4));
              for (local_24 = 0; (int)local_24 < 4 && (int)local_24 < local_20;
                  local_24 = local_24 + 1) {
                printf(" %08x",(ulong)auStack_138[(int)(local_24 + local_140 * 4)]);
              }
              printf("\n");
            }
          }
          local_1c = local_1c + 4;
        }
        local_4 = 0;
      }
      else {
        fprintf(_stderr,"No address specified.\n");
        local_4 = 1;
      }
    }
    else {
      if (nva_cardsnum == 0) {
        fprintf(_stderr,"No cards found.\n");
      }
      else {
        fprintf(_stderr,"No such card.\n");
      }
      local_4 = 1;
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	int32_t a, b = 4, i;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	a &= ~3;
	if (optind + 1 < argc)
		sscanf (argv[optind + 1], "%x", &b);
	int ls = 1;
	while (b > 0) {
		uint32_t selector = a|0xffc;
		uint32_t z[0x40];
		int s = 0, j;
		for (i = 0; i < 0x40; i++) {
			nva_wr32(cnum, selector, i);
			if ((z[i] = nva_rd32(cnum, a))) s |= 1 << (i/4);
		}
		nva_wr32(cnum, selector, 0);
		for (j = 0; j < 0x10; ++j) {
			if (s & (1<<j)) {
				ls = 1;
				printf ("%08x.%02x:", a, j * 0x10);
				for (i = 0; i < 4 && i < b; i++) {
					printf (" %08x", z[i + j*4]);
				}
				printf ("\n");
			} else  {
				if (ls) printf ("...\n"), ls = 0;
			}
		}
		a+=4;
		b-=4;
	}
	return 0;
}